

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptrcircularlist.h
# Opt level: O0

int __thiscall
cookmem::
CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
::remove(CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
         *this,char *__filename)

{
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  Exception *this_00;
  SmallMemChunk *head;
  SmallMemChunk *next;
  SmallMemChunk *prev;
  CircularList<cookmem::MemPool<cookmem::FixedArena,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *this_local;
  
  if (this->m_head == (SmallMemChunk *)0x0) {
    this_local._0_4_ = 0;
  }
  else {
    pSVar1 = this->m_head->prev;
    pSVar2 = this->m_head->next;
    this_local._0_4_ = (int)this->m_head;
    if (this->m_head == pSVar1) {
      if (this->m_head != pSVar2) {
        this_00 = (Exception *)__cxa_allocate_exception(0x10);
        Exception::Exception(this_00,MEM_ERROR_ASSERT,"assertion failure.");
        __cxa_throw(this_00,&Exception::typeinfo,0);
      }
      this->m_head = (SmallMemChunk *)0x0;
    }
    else {
      pSVar1->next = pSVar2;
      pSVar2->prev = pSVar1;
      this->m_head = pSVar2;
    }
  }
  return (int)this_local;
}

Assistant:

Node*
    remove ()
    {
        if (m_head == nullptr)
        {
            return nullptr;
        }

        Node* prev = m_head->prev;
        Node* next = m_head->next;
        Node* head = m_head;

        if (m_head == prev)
        {
            COOKMEM_ASSERT(m_head == next);
            m_head = nullptr;
        }
        else
        {
            prev->next = next;
            next->prev = prev;
            m_head = next;
        }

        return head;
    }